

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O3

void __thiscall
cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPoolInternal *this,cmWorkerPool *pool)

{
  _Head_base<0UL,_uv_loop_s_*,_false> _Var1;
  _Head_base<0UL,_uv_loop_s_*,_false> loop;
  pointer *__ptr;
  
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->UVRequestEnd).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle
  .super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Mutex).super___mutex_base._M_mutex.__align = 0;
  (this->UVRequestBegin).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->UVRequestEnd).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.handle
  .super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
  super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
  super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl = (uv_loop_s *)0x0;
  (this->UVRequestBegin).super_uv_handle_ptr_<uv_async_s>.super_uv_handle_ptr_base_<uv_async_s>.
  handle.super___shared_ptr<uv_async_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  *(undefined4 *)((long)&(this->Mutex).super___mutex_base._M_mutex + 0x27) = 0;
  this->WorkersRunning = 0;
  this->WorkersIdle = 0;
  *(undefined8 *)&this->JobsProcessing = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map_size + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4) = 0;
  *(undefined8 *)
   ((long)&(this->Queue).
           super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first + 4) = 0;
  (this->Queue).
  super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->Queue).
  super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
  ::_M_initialize_map(&(this->Queue).
                       super__Deque_base<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>,_std::allocator<std::unique_ptr<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_>_>_>
                      ,0);
  std::condition_variable::condition_variable(&this->Condition);
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Workers).
  super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Pool = pool;
  uv_disable_stdio_inheritance();
  loop._M_head_impl = (uv_loop_s *)operator_new(0x350);
  memset(loop._M_head_impl,0,0x350);
  _Var1._M_head_impl =
       (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
       super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
       super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl;
  (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
  super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
  super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl = loop._M_head_impl;
  if (_Var1._M_head_impl != (uv_loop_s *)0x0) {
    operator_delete(_Var1._M_head_impl,0x350);
    loop._M_head_impl =
         (this->UVLoop)._M_t.super___uniq_ptr_impl<uv_loop_s,_std::default_delete<uv_loop_s>_>._M_t.
         super__Tuple_impl<0UL,_uv_loop_s_*,_std::default_delete<uv_loop_s>_>.
         super__Head_base<0UL,_uv_loop_s_*,_false>._M_head_impl;
  }
  uv_loop_init(loop._M_head_impl);
  return;
}

Assistant:

cmWorkerPoolInternal::cmWorkerPoolInternal(cmWorkerPool* pool)
  : Pool(pool)
{
  // Initialize libuv loop
  uv_disable_stdio_inheritance();
#ifdef CMAKE_UV_SIGNAL_HACK
  UVHackRAII = cm::make_unique<cmUVSignalHackRAII>();
#endif
  UVLoop = cm::make_unique<uv_loop_t>();
  uv_loop_init(UVLoop.get());
}